

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

char * __thiscall QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame(QGles2Buffer *this)

{
  QRhiImplementation *pQVar1;
  char *pcVar2;
  
  if (((this->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
       super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 4) == 0) {
    pQVar1 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
    (**(code **)(*pQVar1[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.
                  ptr + 400))(this->targetForDataOps,this->buffer);
    if ((pQVar1[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array[0x5f] & 2U) != 0) {
      pcVar2 = (char *)(**(code **)(*pQVar1[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.
                                     super_QVLABaseBase.ptr + 0x550))
                                 (this->targetForDataOps,0,
                                  *(undefined4 *)&(this->super_QRhiBuffer).field_0x3c,10);
      return pcVar2;
    }
    if ((this->data).d.size == 0) {
      QByteArray::resize((longlong)&this->data);
    }
  }
  pcVar2 = QByteArray::data(&this->data);
  return pcVar2;
}

Assistant:

char *QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame()
{
    Q_ASSERT(m_type == Dynamic);
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        if (rhiD->caps.properMapBuffer) {
            return static_cast<char *>(rhiD->f->glMapBufferRange(targetForDataOps, 0, nonZeroSize,
                                                                 GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
        } else {
            // Need some storage for the data, use the otherwise unused 'data' member.
            if (data.isEmpty())
                data.resize(nonZeroSize);
        }
    }
    return data.data();
}